

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceEnumOverclockDomains
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_overclock_handle_t *phDomainHandle)

{
  zes_overclock_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  zes_pfnDeviceEnumOverclockDomains_t pfnEnumOverclockDomains;
  ze_result_t result;
  zes_overclock_handle_t *phDomainHandle_local;
  uint32_t *pCount_local;
  zes_device_handle_t hDevice_local;
  
  pfnEnumOverclockDomains._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cad8 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phDomainHandle != (zes_overclock_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zes_overclock_handle_t)context_t::get((context_t *)&context);
      phDomainHandle[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnEnumOverclockDomains._4_4_ = (*DAT_0011cad8)(hDevice,pCount,phDomainHandle);
  }
  return pfnEnumOverclockDomains._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumOverclockDomains(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_overclock_handle_t* phDomainHandle          ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEnumOverclockDomains = context.zesDdiTable.Device.pfnEnumOverclockDomains;
        if( nullptr != pfnEnumOverclockDomains )
        {
            result = pfnEnumOverclockDomains( hDevice, pCount, phDomainHandle );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phDomainHandle ) && ( i < *pCount ); ++i )
                phDomainHandle[ i ] = reinterpret_cast<zes_overclock_handle_t>( context.get() );

        }

        return result;
    }